

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsl_optimizer.cpp
# Opt level: O3

glslopt_shader *
glslopt_optimize(glslopt_ctx *ctx,glslopt_shader_type type,char *shaderSource,uint options)

{
  gl_shader *pgVar1;
  gl_shader_program *prog;
  exec_node *peVar2;
  exec_node *peVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  int iVar19;
  uint uVar20;
  glslopt_shader *this;
  _mesa_glsl_parse_state *this_00;
  exec_list *instructions;
  char *pcVar21;
  loop_state *ls;
  GLenum16 GVar22;
  gl_shader_stage gVar23;
  byte bVar24;
  long lVar25;
  PrintGlslMode local_54;
  char *local_40;
  gl_linked_shader *local_38;
  
  local_40 = shaderSource;
  this = (glslopt_shader *)glslopt_shader::operator_new(0xa050,ctx->mem_ctx);
  glslopt_shader::glslopt_shader(this);
  pgVar1 = this->shader;
  if (type == kGlslOptShaderVertex) {
    local_54 = kPrintGlslVertex;
    GVar22 = 0x8b31;
    gVar23 = MESA_SHADER_VERTEX;
  }
  else {
    if (type != kGlslOptShaderFragment) {
      local_54 = kPrintGlslVertex;
      if (pgVar1->Type == 0) {
        pcVar21 = ralloc_asprintf(this,"Unknown shader type %d",type);
        this->infoLog = pcVar21;
        this->status = false;
        return this;
      }
      goto LAB_0014ea1e;
    }
    local_54 = kPrintGlslFragment;
    gVar23 = MESA_SHADER_FRAGMENT;
    GVar22 = 0x8b30;
  }
  pgVar1->Type = GVar22;
  pgVar1->Stage = gVar23;
LAB_0014ea1e:
  this_00 = (_mesa_glsl_parse_state *)_mesa_glsl_parse_state::operator_new(0x588,this);
  _mesa_glsl_parse_state::_mesa_glsl_parse_state(this_00,&ctx->mesa_ctx,this->shader->Stage,this);
  this_00->error = false;
  if ((options & 1) == 0) {
    iVar19 = glcpp_preprocess(this_00,&local_40,&this_00->info_log,add_builtin_defines,this_00,
                              &ctx->mesa_ctx);
    this_00->error = iVar19 != 0;
    shaderSource = local_40;
    if (iVar19 != 0) {
      this->status = false;
      this->infoLog = this_00->info_log;
      return this;
    }
  }
  _mesa_glsl_lexer_ctor(this_00,shaderSource);
  _mesa_glsl_parse(this_00);
  _mesa_glsl_lexer_dtor(this_00);
  instructions = (exec_list *)exec_list::operator_new(0x20,this);
  (instructions->head_sentinel).next = &instructions->tail_sentinel;
  (instructions->head_sentinel).prev = (exec_node *)0x0;
  (instructions->tail_sentinel).next = (exec_node *)0x0;
  (instructions->tail_sentinel).prev = (exec_node *)instructions;
  this->shader->ir = instructions;
  bVar24 = this_00->error;
  if (((bool)bVar24 == false) &&
     ((this_00->translation_unit).head_sentinel.next != &(this_00->translation_unit).tail_sentinel))
  {
    _mesa_ast_to_hir(instructions,this_00);
    bVar24 = this_00->error;
  }
  if ((bVar24 & 1) == 0) {
    validate_ir_tree(instructions);
    pcVar21 = ralloc_strdup(this,"");
    pcVar21 = _mesa_print_ir_glsl(instructions,this_00,pcVar21,local_54);
    this->rawOutput = pcVar21;
  }
  lower_builtins(instructions);
  this->shader->symbols = this_00->symbols;
  bVar24 = this_00->error;
  local_38 = (gl_linked_shader *)0x0;
  if ((((bool)bVar24 == false) && ((options & 2) == 0)) &&
     ((instructions->head_sentinel).next != &instructions->tail_sentinel)) {
    prog = this->whole_program;
    local_38 = link_intrastage_shaders(this,&ctx->mesa_ctx,prog,prog->Shaders,prog->NumShaders,true)
    ;
    if (local_38 == (gl_linked_shader *)0x0) {
      this->status = false;
      this->infoLog = this->whole_program->data->InfoLog;
      return this;
    }
    instructions = local_38->ir;
    bVar24 = this_00->error;
  }
  if (((bVar24 & 1) == 0) && ((instructions->head_sentinel).next != &instructions->tail_sentinel)) {
    uVar20 = 0;
    do {
      if ((options & 2) == 0) {
        bVar4 = do_function_inlining(instructions);
        bVar5 = do_dead_functions(instructions);
        bVar6 = do_structure_splitting(instructions);
        bVar6 = bVar6 || (bVar5 || bVar4);
      }
      else {
        bVar6 = false;
      }
      bVar4 = do_if_simplification(instructions);
      bVar5 = opt_flatten_nested_if_blocks(instructions);
      bVar7 = do_copy_propagation_elements(instructions);
      bVar24 = (bVar7 || bVar5) | bVar4 | bVar6;
      if ((options & 2) == 0) {
        bVar6 = do_vectorize(instructions);
        bVar24 = bVar24 | bVar6;
        bVar6 = do_dead_code(instructions,false);
      }
      else {
        bVar6 = do_dead_code_unlinked(instructions);
      }
      bVar4 = do_dead_code_local(instructions);
      bVar5 = do_tree_grafting(instructions);
      bVar7 = do_constant_propagation(instructions);
      if ((options & 2) == 0) {
        bVar8 = do_constant_variable(instructions);
      }
      else {
        bVar8 = do_constant_variable_unlinked(instructions);
      }
      bVar9 = do_constant_folding(instructions);
      bVar10 = do_minmax_prune(instructions);
      bVar11 = do_rebalance_tree(instructions);
      bVar12 = do_algebraic(instructions,(this_00->ctx->Const).NativeIntegers != '\0',
                            (this_00->ctx->Const).ShaderCompilerOptions + this_00->stage);
      bVar13 = do_lower_jumps(instructions,true,true,false,false,false);
      bVar14 = do_vec_index_to_swizzle(instructions);
      bVar15 = lower_vector_insert(instructions,false);
      bVar16 = optimize_swizzles(instructions);
      bVar17 = optimize_split_arrays(instructions,(options & 2) == 0);
      bVar18 = optimize_redundant_jumps(instructions);
      bVar24 = bVar18 | bVar17 | bVar16 | bVar15 | bVar14 | bVar13 | (bVar11 || (bVar10 || bVar9)) |
                                                                     bVar7 | bVar5 | bVar4 | bVar8 |
                                                                     bVar24 | bVar6 | bVar12;
      if ((options & 2) == 0) {
        ls = analyze_loop_variables(instructions);
        if (ls->loop_found == true) {
          bVar6 = unroll_loops(instructions,ls,
                               (this_00->ctx->Const).ShaderCompilerOptions + this_00->stage);
          bVar24 = bVar24 | bVar6;
        }
        loop_state::~loop_state(ls);
        operator_delete(ls);
      }
    } while ((bVar24 != 0) && (bVar6 = uVar20 < 999, uVar20 = uVar20 + 1, bVar6));
    lower_instructions(instructions,0x400);
    validate_ir_tree(instructions);
    bVar24 = this_00->error;
  }
  if ((bVar24 & 1) == 0) {
    pcVar21 = ralloc_strdup(this,"");
    pcVar21 = _mesa_print_ir_glsl(instructions,this_00,pcVar21,local_54);
    this->optimizedOutput = pcVar21;
    bVar24 = this_00->error;
  }
  this->status = (bool)(bVar24 ^ 1);
  this->infoLog = this_00->info_log;
  peVar2 = (instructions->head_sentinel).next;
  peVar3 = peVar2->next;
  do {
    if (peVar3 == (exec_node *)0x0) {
      ralloc_free(instructions);
      ralloc_free(this_00);
      if (local_38 != (gl_linked_shader *)0x0) {
        ralloc_free(local_38);
      }
      return this;
    }
    if (*(int *)&peVar2[1].next == 7) {
      uVar20 = *(uint *)&peVar2[3].prev;
      if ((uVar20 & 0xf000) == 0x4000) {
        lVar25 = (long)this->inputCount;
        if (0x7f < lVar25) goto LAB_0014ef8e;
        pcVar21 = ralloc_strdup(this,(char *)peVar2[2].next);
        this->inputs[lVar25].name = pcVar21;
        iVar19 = -1;
        if (((ulong)peVar2[3].prev & 0x40000) != 0) {
          iVar19 = *(int *)&peVar2[4].prev;
        }
        this->inputs[lVar25].location = iVar19;
        this->inputCount = this->inputCount + 1;
        uVar20 = *(uint *)&peVar2[3].prev;
      }
      if (((uVar20 & 0xf000) == 0x1000) && (*(char *)((long)&(peVar2[1].prev)->next + 4) != '\f')) {
        lVar25 = (long)this->uniformCount;
        if (0x3ff < lVar25) goto LAB_0014ef8e;
        pcVar21 = ralloc_strdup(this,(char *)peVar2[2].next);
        this->uniforms[lVar25].name = pcVar21;
        iVar19 = -1;
        if (((ulong)peVar2[3].prev & 0x40000) != 0) {
          iVar19 = *(int *)&peVar2[4].prev;
        }
        this->uniforms[lVar25].location = iVar19;
        this->uniformCount = this->uniformCount + 1;
        uVar20 = *(uint *)&peVar2[3].prev;
      }
      if ((((uVar20 & 0xf000) == 0x1000) && (*(char *)((long)&(peVar2[1].prev)->next + 4) == '\f'))
         && (lVar25 = (long)this->textureCount, lVar25 < 0x80)) {
        pcVar21 = ralloc_strdup(this,(char *)peVar2[2].next);
        this->textures[lVar25].name = pcVar21;
        iVar19 = -1;
        if (((ulong)peVar2[3].prev & 0x40000) != 0) {
          iVar19 = *(int *)&peVar2[4].prev;
        }
        this->textures[lVar25].location = iVar19;
        this->textureCount = this->textureCount + 1;
      }
    }
LAB_0014ef8e:
    peVar2 = peVar2->next;
    peVar3 = peVar2->next;
  } while( true );
}

Assistant:

glslopt_shader* glslopt_optimize (glslopt_ctx* ctx, glslopt_shader_type type, const char* shaderSource, unsigned options)
{
	glslopt_shader* shader = new (ctx->mem_ctx) glslopt_shader ();

	PrintGlslMode printMode = kPrintGlslVertex;
	switch (type) {
	case kGlslOptShaderVertex:
			shader->shader->Type = GL_VERTEX_SHADER;
			shader->shader->Stage = MESA_SHADER_VERTEX;
			printMode = kPrintGlslVertex;
			break;
	case kGlslOptShaderFragment:
			shader->shader->Type = GL_FRAGMENT_SHADER;
			shader->shader->Stage = MESA_SHADER_FRAGMENT;
			printMode = kPrintGlslFragment;
			break;
	}
	if (!shader->shader->Type)
	{
		shader->infoLog = ralloc_asprintf (shader, "Unknown shader type %d", (int)type);
		shader->status = false;
		return shader;
	}

	_mesa_glsl_parse_state* state = new (shader) _mesa_glsl_parse_state (&ctx->mesa_ctx, shader->shader->Stage, shader);
	state->error = 0;

	if (!(options & kGlslOptionSkipPreprocessor))
	{
		state->error = !!glcpp_preprocess (state, &shaderSource, &state->info_log, add_builtin_defines, state, &ctx->mesa_ctx);
		if (state->error)
		{
			shader->status = !state->error;
			shader->infoLog = state->info_log;
			return shader;
		}
	}

	_mesa_glsl_lexer_ctor (state, shaderSource);
	_mesa_glsl_parse (state);
	_mesa_glsl_lexer_dtor (state);

	exec_list* ir = new (shader) exec_list();
	shader->shader->ir = ir;

	if (!state->error && !state->translation_unit.is_empty())
		_mesa_ast_to_hir (ir, state);

	// Un-optimized output
	if (!state->error) {
		validate_ir_tree(ir);
		shader->rawOutput = _mesa_print_ir_glsl(ir, state, ralloc_strdup(shader, ""), printMode);
	}

	// Lower builtin functions prior to linking.
	lower_builtins(ir);

	// Link built-in functions
	shader->shader->symbols = state->symbols;
	
	struct gl_linked_shader* linked_shader = NULL;

	if (!state->error && !ir->is_empty() && !(options & kGlslOptionNotFullShader))
	{
		linked_shader = link_intrastage_shaders(shader,
												&ctx->mesa_ctx,
												shader->whole_program,
												shader->whole_program->Shaders,
												shader->whole_program->NumShaders,
												true);
		if (!linked_shader)
		{
			shader->status = false;
			shader->infoLog = shader->whole_program->data->InfoLog;
			return shader;
		}
		ir = linked_shader->ir;
		
		debug_print_ir ("==== After link ====", ir, state, shader);
	}

	// Do optimization post-link
	if (!state->error && !ir->is_empty())
	{		
		const bool linked = !(options & kGlslOptionNotFullShader);
		do_optimization_passes(ir, linked, state, shader);
		validate_ir_tree(ir);
	}	
	
	// Final optimized output
	if (!state->error)
	{
		shader->optimizedOutput = _mesa_print_ir_glsl(ir, state, ralloc_strdup(shader, ""), printMode);
	}

	shader->status = !state->error;
	shader->infoLog = state->info_log;

	find_shader_variables (shader, ir);
	// FIXME: stats
	// if (!state->error)
	// 	calculate_shader_stats (ir, &shader->statsMath, &shader->statsTex, &shader->statsFlow);

	ralloc_free (ir);
	ralloc_free (state);

	if (linked_shader)
		ralloc_free(linked_shader);

	return shader;
}